

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::applySpirvDecorate
          (TGlslangToSpvTraverser *this,TType *type,Id id,optional<int> member)

{
  Builder *this_00;
  _Base_ptr p_Var1;
  TIntermTyped *node;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *pTVar2;
  TMap<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>_> *pTVar3;
  int iVar4;
  Id IVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var6;
  _Storage<int,_true> member_00;
  undefined8 extraout_RDX;
  const_iterator __begin2;
  _Base_ptr p_Var7;
  const_iterator __begin3;
  _Rb_tree_node_base *p_Var8;
  undefined1 auVar9 [16];
  char *string;
  TSpirvDecorate *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  
  iVar4 = (*type->_vptr_TType[0xb])(type);
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x40) == 0) {
    __assert_fail("type.getQualifier().hasSpirvDecorate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x14b8,
                  "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                 );
  }
  iVar4 = (*type->_vptr_TType[0xb])(type);
  local_70 = glslang::TQualifier::getSpirvDecorate((TQualifier *)CONCAT44(extraout_var_00,iVar4));
  auVar9._8_8_ = extraout_RDX;
  auVar9._0_8_ = (local_70->decorates).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar2 = &local_70->decorates;
  this_00 = &this->builder;
  while (p_Var8 = auVar9._0_8_,
        member_00._M_value =
             member.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload,
        (_Rb_tree_header *)p_Var8 !=
        &(pTVar2->
         super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
         )._M_t._M_impl.super__Rb_tree_header) {
    if (p_Var8[1]._M_left == p_Var8[1]._M_right) {
      if (((ulong)member.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) {
        spv::Builder::addDecoration(this_00,id,p_Var8[1]._M_color,-1);
      }
      else {
        spv::Builder::addMemberDecoration(this_00,id,member_00._M_value,p_Var8[1]._M_color,-1);
      }
    }
    else {
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TranslateLiterals((TGlslangToSpvTraverser *)&p_Var8[1]._M_parent,
                        (TVector<const_glslang::TIntermConstantUnion_*> *)&literals,auVar9._8_8_);
      if (((ulong)member.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) {
        spv::Builder::addDecoration(this_00,id,p_Var8[1]._M_color,&literals);
      }
      else {
        spv::Builder::addMemberDecoration
                  (this_00,id,member_00._M_value,p_Var8[1]._M_color,&literals);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&literals);
    }
    auVar9 = std::_Rb_tree_increment(p_Var8);
  }
  if (((ulong)member.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    pTVar3 = &local_70->decorateIds;
    for (p_Var6 = (local_70->decorateIds).
                  super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(pTVar3->
         super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
         )._M_t._M_impl.super__Rb_tree_header; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
    {
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var7 = p_Var6[1]._M_left;
      p_Var1 = p_Var6[1]._M_right;
      if (p_Var7 == p_Var1) {
        __assert_fail("!decorateId.second.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x14d4,
                      "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                     );
      }
      for (; p_Var7 != p_Var1; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
        node = *(TIntermTyped **)p_Var7;
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
        if ((*(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x10000007f) == 2) {
          IVar5 = createSpvConstant(this,node);
        }
        else {
          iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
          IVar5 = getSymbolId(this,(TIntermSymbol *)CONCAT44(extraout_var_02,iVar4));
        }
        string = (char *)CONCAT44(string._4_4_,IVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                   (uint *)&string);
      }
      spv::Builder::addDecorationId
                (this_00,id,p_Var6[1]._M_color,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  else if ((local_70->decorateIds).
           super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("spirvDecorate.decorateIds.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x14d0,
                  "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                 );
  }
  p_Var6 = (local_70->decorateStrings).
           super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar2 = &local_70->decorateStrings;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 ==
        &(pTVar2->
         super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
         )._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var7 = p_Var6[1]._M_left;
    p_Var1 = p_Var6[1]._M_right;
    if (p_Var7 == p_Var1) break;
    for (; p_Var7 != p_Var1; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
      string = *(char **)(**(long **)(*(long *)(*(long *)p_Var7 + 0xc0) + 8) + 8);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&literals,&string);
    }
    if (((ulong)member.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      spv::Builder::addDecoration
                (this_00,id,p_Var6[1]._M_color,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&literals);
    }
    else {
      spv::Builder::addMemberDecoration
                (this_00,id,member_00._M_value,p_Var6[1]._M_color,
                 (vector<const_char_*,_std::allocator<const_char_*>_> *)&literals);
    }
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&literals);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  }
  __assert_fail("!decorateString.second.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x14e2,
                "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
               );
}

Assistant:

void TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType& type, spv::Id id, std::optional<int> member)
{
    assert(type.getQualifier().hasSpirvDecorate());

    const glslang::TSpirvDecorate& spirvDecorate = type.getQualifier().getSpirvDecorate();

    // Add spirv_decorate
    for (auto& decorate : spirvDecorate.decorates) {
        if (!decorate.second.empty()) {
            std::vector<unsigned> literals;
            TranslateLiterals(decorate.second, literals);
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first), literals);
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first), literals);
        } else {
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first));
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first));
        }
    }

    // Add spirv_decorate_id
    if (member.has_value()) {
        // spirv_decorate_id not applied to members
        assert(spirvDecorate.decorateIds.empty());
    } else {
        for (auto& decorateId : spirvDecorate.decorateIds) {
            std::vector<spv::Id> operandIds;
            assert(!decorateId.second.empty());
            for (auto extraOperand : decorateId.second) {
                if (extraOperand->getQualifier().isFrontEndConstant())
                    operandIds.push_back(createSpvConstant(*extraOperand));
                else
                    operandIds.push_back(getSymbolId(extraOperand->getAsSymbolNode()));
            }
            builder.addDecorationId(id, static_cast<spv::Decoration>(decorateId.first), operandIds);
        }
    }

    // Add spirv_decorate_string
    for (auto& decorateString : spirvDecorate.decorateStrings) {
        std::vector<const char*> strings;
        assert(!decorateString.second.empty());
        for (auto extraOperand : decorateString.second) {
            const char* string = extraOperand->getConstArray()[0].getSConst()->c_str();
            strings.push_back(string);
        }
        if (member.has_value())
            builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorateString.first), strings);
        else
            builder.addDecoration(id, static_cast<spv::Decoration>(decorateString.first), strings);
    }
}